

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operations.h
# Opt level: O1

void removeDirectory(string *path)

{
  pointer pcVar1;
  char *__s2;
  int iVar2;
  int iVar3;
  int parentid;
  long lVar4;
  undefined1 *puVar5;
  string names [100];
  char *local_d28;
  long local_d20;
  char local_d18 [16];
  char *local_d08;
  long local_d00;
  char local_cf8 [16];
  char *local_ce8;
  long local_ce0;
  char local_cd8 [16];
  string local_cc8;
  string local_ca8 [99];
  undefined8 auStack_48 [2];
  char local_38 [16];
  
  lVar4 = 0x10;
  do {
    puVar5 = (undefined1 *)((long)&local_ca8[0]._M_dataplus._M_p + lVar4);
    *(undefined1 **)((long)local_ca8 + lVar4 + -0x10) = puVar5;
    *(undefined8 *)((long)local_ca8 + lVar4 + -8) = 0;
    *puVar5 = 0;
    lVar4 = lVar4 + 0x20;
  } while (lVar4 != 0xc90);
  pcVar1 = (path->_M_dataplus)._M_p;
  local_cc8._M_dataplus._M_p = (pointer)&local_cc8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_cc8,pcVar1,pcVar1 + path->_M_string_length);
  iVar2 = parsePath(&local_cc8,local_ca8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_cc8._M_dataplus._M_p != &local_cc8.field_2) {
    operator_delete(local_cc8._M_dataplus._M_p);
  }
  pcVar1 = (path->_M_dataplus)._M_p;
  local_ce8 = local_cd8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_ce8,pcVar1,pcVar1 + path->_M_string_length);
  iVar3 = doesExist(local_ca8,iVar2,local_ce0 == 0 || *local_ce8 != '/');
  if (local_ce8 != local_cd8) {
    operator_delete(local_ce8);
  }
  if (iVar3 == iVar2) {
    pcVar1 = (path->_M_dataplus)._M_p;
    local_d08 = local_cf8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_d08,pcVar1,pcVar1 + path->_M_string_length);
    iVar3 = getId(local_ca8,iVar2,local_d00 == 0 || *local_d08 != '/');
    if (local_d08 != local_cf8) {
      operator_delete(local_d08);
    }
    pcVar1 = (path->_M_dataplus)._M_p;
    local_d28 = local_d18;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_d28,pcVar1,pcVar1 + path->_M_string_length);
    parentid = getId(local_ca8,iVar2 + -1,local_d20 == 0 || *local_d28 != '/');
    if (local_d28 != local_d18) {
      operator_delete(local_d28);
    }
    delDirOrFile(iVar3,parentid);
    iVar3 = inodes[parentid].i_blocks[0];
    __s2 = local_ca8[iVar2 + -1]._M_dataplus._M_p;
    lVar4 = 0;
    do {
      iVar2 = strcmp(emptyspaces + lVar4 + (long)iVar3 * 0x1000,__s2);
      if (iVar2 == 0) {
        memset(emptyspaces + lVar4 + (long)iVar3 * 0x1000,0,0x100);
        break;
      }
      lVar4 = lVar4 + 0x100;
    } while (lVar4 != 0x1000);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Path is illegal",0xf);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18));
    std::ostream::put('\0');
    std::ostream::flush();
  }
  lVar4 = 0;
  do {
    if (local_38 + lVar4 != *(char **)((long)auStack_48 + lVar4)) {
      operator_delete(*(char **)((long)auStack_48 + lVar4));
    }
    lVar4 = lVar4 + -0x20;
  } while (lVar4 != -0xc80);
  return;
}

Assistant:

void removeDirectory(string path) {
    string names[100];
    int layers = parsePath(path, names);
    int legal_layers = doesExist(names, layers, getPathType(path) == RELATIVE_PATH);
    if (legal_layers == layers) {
        int id = getId(names, layers, getPathType(path) == RELATIVE_PATH);
        int parentid = getId(names, layers - 1, getPathType(path) == RELATIVE_PATH);
        delDirOrFile(id, parentid);
        dir_block *parent = getAddressByLocation_Folder(inodes[parentid].i_blocks[0]);
        for (int i = 0; i < 16; i++) {
            if (strcmp(parent->dirs[i].name, names[layers - 1].c_str()) == 0) {
                dir_entry *temp = &parent->dirs[i];
                memset(temp, '\0', sizeof(dir_entry));
                break;
            }
        }
    }
    else {
        setColor(COLOR_ERR);
        cout << "Path is illegal" << endl;
        setColor(COLOR_ORIGIN);
    }
}